

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O1

uint32_t __thiscall spvtools::opt::InstrumentPass::GetUint64Id(InstrumentPass *this)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t uVar1;
  Type *type;
  Integer uint64_ty;
  Type local_58;
  undefined1 local_30;
  
  if (this->uint64_id_ == 0) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    this_01 = (this_00->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    local_58.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.kind_ = kInteger;
    local_58._36_4_ = 0x40;
    local_58._vptr_Type = (_func_int **)&PTR__Type_003ed780;
    local_30 = 0;
    type = analysis::TypeManager::GetRegisteredType(this_01,&local_58);
    uVar1 = analysis::TypeManager::GetTypeInstruction(this_01,type);
    this->uint64_id_ = uVar1;
    local_58._vptr_Type = (_func_int **)&PTR__Type_003e9e18;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_58.decorations_);
  }
  return this->uint64_id_;
}

Assistant:

uint32_t InstrumentPass::GetUint64Id() {
  if (uint64_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Integer uint64_ty(64, false);
    analysis::Type* reg_uint64_ty = type_mgr->GetRegisteredType(&uint64_ty);
    uint64_id_ = type_mgr->GetTypeInstruction(reg_uint64_ty);
  }
  return uint64_id_;
}